

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  scoped_ptr<google::protobuf::io::Printer> printer_00;
  int iVar1;
  ClassNameResolver *this_00;
  undefined4 extraout_var;
  Printer *pPVar2;
  ZeroCopyOutputStream *output_00;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  scoped_ptr<google::protobuf::io::Printer> printer;
  allocator<char> local_171;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string filename;
  string classname;
  GeneratedCodeInfo annotations;
  string local_f0;
  string info_full_path;
  string java_package;
  string info_relative_path;
  string local_70;
  string package_dir;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  
  FileJavaPackage_abi_cxx11_
            (&java_package,(java *)this->file_,(FileDescriptor *)0x1,SUB81(annotation_file_list,0));
  std::__cxx11::string::string((string *)&local_70,(string *)&java_package);
  JavaPackageToDir(&package_dir,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    this_00 = internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::operator->
                        (&this->name_resolver_);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&classname,this_00,this->file_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&annotations
                   ,&package_dir,&classname);
    std::operator+(&filename,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&annotations
                   ,".java");
    std::__cxx11::string::~string((string *)&annotations);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,&filename);
    iVar1 = (*context->_vptr_GeneratorContext[2])(context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
    GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
    annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
         (_func_int **)&PTR_AddAnnotation_00425d68;
    annotation_collector.annotation_proto_ = &annotations;
    printer.ptr_ = (Printer *)operator_new(0x88);
    annotation_collector_00 = &annotation_collector;
    if ((this->options_).annotate_code == false) {
      annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0
      ;
    }
    io::Printer::Printer
              (printer.ptr_,output,'$',&annotation_collector_00->super_AnnotationCollector);
    std::operator+(&info_relative_path,&classname,".java.pb.meta");
    std::operator+(&info_full_path,&filename,".pb.meta");
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Print(pPVar2,
                       "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                       ,"filename",*(string **)this->file_);
    if (java_package._M_string_length != 0) {
      pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
      io::Printer::Print(pPVar2,"package $package$;\n\n","package",&java_package);
    }
    printer_00.ptr_ = printer.ptr_;
    if ((this->options_).annotate_code == true) {
      std::__cxx11::string::string((string *)&local_f0,(string *)&info_relative_path);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_171);
    }
    PrintGeneratedAnnotation(printer_00.ptr_,'$',&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Print(pPVar2,
                       "public final class $classname$ {\n  public static com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n  static {\n"
                       ,"classname",&classname);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Annotate(pPVar2,"classname",*(string **)this->file_);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Indent(pPVar2);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Indent(pPVar2);
    GenerateDescriptors(this,printer.ptr_);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Outdent(pPVar2);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Outdent(pPVar2);
    pPVar2 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->(&printer);
    io::Printer::Print(pPVar2,"  }\n}\n");
    if ((this->options_).annotate_code == true) {
      iVar1 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
      output_00 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar1);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,output_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,&info_full_path);
      if (output_00 != (ZeroCopyOutputStream *)0x0) {
        (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
      }
    }
    internal::scoped_ptr<google::protobuf::io::Printer>::reset(&printer,(Printer *)0x0);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
    std::__cxx11::string::~string((string *)&info_full_path);
    std::__cxx11::string::~string((string *)&info_relative_path);
    internal::scoped_ptr<google::protobuf::io::Printer>::~scoped_ptr(&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&classname);
  }
  std::__cxx11::string::~string((string *)&package_dir);
  std::__cxx11::string::~string((string *)&java_package);
  return;
}

Assistant:

void SharedCodeGenerator::Generate(GeneratorContext* context,
                                   std::vector<string>* file_list,
                                   std::vector<string>* annotation_file_list) {
  string java_package = FileJavaPackage(file_);
  string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    string classname = name_resolver_->GetDescriptorClassName(file_);
    string filename = package_dir + classname + ".java";
    file_list->push_back(filename);
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    google::protobuf::scoped_ptr<io::Printer> printer(
        new io::Printer(output.get(), '$',
                        options_.annotate_code ? &annotation_collector : NULL));
    string info_relative_path = classname + ".java.pb.meta";
    string info_full_path = filename + ".pb.meta";
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// source: $filename$\n"
        "\n",
        "filename", file_->name());
    if (!java_package.empty()) {
      printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "");
    printer->Print(
        "public final class $classname$ {\n"
        "  public static com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n"
        "  static {\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    printer->Outdent();
    printer->Outdent();
    printer->Print(
      "  }\n"
      "}\n");

    if (options_.annotate_code) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}